

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall Expr_symbol2_Test::TestBody(Expr_symbol2_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr *ex;
  AssertHelper local_100;
  Message local_f8;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  string result;
  ExprPtr local_88;
  undefined1 local_78 [8];
  ExprPtr expr;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  ExprPtr y;
  ExprPtr x;
  Expr_symbol2_Test *this_local;
  
  mathiu::impl::operator____i
            ((impl *)&y.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"y",&local_51);
  mathiu::impl::symbol((impl *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  mathiu::impl::operator/
            ((impl *)&local_88,
             (ExprPtr *)
             &y.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(ExprPtr *)local_30);
  mathiu::impl::operator*
            ((impl *)(result.field_2._M_local_buf + 8),(ExprPtr *)local_30,(ExprPtr *)local_30);
  mathiu::impl::operator-((impl *)local_78,&local_88,(ExprPtr *)((long)&result.field_2 + 8));
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)((long)&result.field_2 + 8));
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_88);
  mathiu::impl::toString_abi_cxx11_((string *)&gtest_ar.message_,(impl *)local_78,ex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"(+ (* 5 (^ y -1)) (* -1 (^ y 2)))",&local_e9);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_c8,"result","std::string(\"(+ (* 5 (^ y -1)) (* -1 (^ y 2)))\")",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/expr.cpp"
               ,0x90,message);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_78);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_30);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &y.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

TEST(Expr, symbol2)
{
    auto x = 5_i;
    auto y = symbol("y");
    auto expr = x / y - y * y;
    auto result = toString(expr);
    EXPECT_EQ(result, std::string("(+ (* 5 (^ y -1)) (* -1 (^ y 2)))"));
}